

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

CollationKey * __thiscall
icu_63::RuleBasedCollator::getCollationKey
          (RuleBasedCollator *this,UnicodeString *s,CollationKey *key,UErrorCode *errorCode)

{
  ushort uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  char16_t *pcVar3;
  undefined4 extraout_var;
  uint uVar4;
  
  uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar3 = (s->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&s->fUnion + 2);
    }
  }
  else {
    pcVar3 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    uVar4 = (s->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)(short)uVar1 >> 5;
  }
  UNRECOVERED_JUMPTABLE = (this->super_Collator).super_UObject._vptr_UObject[0xf];
  iVar2 = (*UNRECOVERED_JUMPTABLE)(this,pcVar3,(ulong)uVar4,key,errorCode,UNRECOVERED_JUMPTABLE);
  return (CollationKey *)CONCAT44(extraout_var,iVar2);
}

Assistant:

CollationKey &
RuleBasedCollator::getCollationKey(const UnicodeString &s, CollationKey &key,
                                   UErrorCode &errorCode) const {
    return getCollationKey(s.getBuffer(), s.length(), key, errorCode);
}